

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_stream.cpp
# Opt level: O1

bool __thiscall dap::ContentReader::scan(ContentReader *this,uint8_t *seq,size_t len)

{
  bool bVar1;
  bool bVar2;
  
  bVar1 = buffer(this,len);
  if ((bVar1) && (bVar2 = match(this,seq,len), !bVar2)) {
    do {
      std::deque<unsigned_char,_std::allocator<unsigned_char>_>::pop_front(&this->buf);
      bVar1 = buffer(this,len);
      if (!bVar1) {
        return bVar1;
      }
      bVar2 = match(this,seq,len);
    } while (!bVar2);
  }
  return bVar1;
}

Assistant:

bool ContentReader::scan(const uint8_t* seq, size_t len) {
  while (buffer(len)) {
    if (match(seq, len)) {
      return true;
    }
    buf.pop_front();
  }
  return false;
}